

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O2

bool __thiscall bloom_parameters::compute_optimal_parameters(bloom_parameters *this)

{
  unsigned_long_long uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  ulong uVar14;
  
  bVar4 = operator!(this);
  if (!bVar4) {
    dVar13 = 0.0;
    uVar14 = 0;
    dVar9 = INFINITY;
    for (dVar12 = 1.0; dVar12 < 1000.0; dVar12 = dVar12 + 1.0) {
      uVar1 = this->projected_element_count;
      dVar3 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
      dVar10 = pow(this->false_positive_probability,1.0 / dVar12);
      dVar10 = log(1.0 - dVar10);
      dVar10 = ((dVar3 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * -dVar12)
               / dVar10;
      auVar11._0_8_ = ~-(ulong)(dVar10 < dVar9) & (ulong)dVar13;
      auVar11._8_8_ = ~(ulong)dVar3 & uVar14;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = -(ulong)(dVar10 < dVar9) & (ulong)dVar12;
      if (dVar9 <= dVar10) {
        dVar10 = dVar9;
      }
      dVar13 = SUB168(auVar11 | auVar2,0);
      uVar14 = SUB168(auVar11 | auVar2,8);
      dVar9 = dVar10;
    }
    uVar5 = (uint)(long)dVar13;
    (this->optimal_parameters).number_of_hashes = uVar5;
    uVar14 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
    uVar6 = (ulong)((uint)uVar14 & 7);
    lVar7 = 8 - uVar6;
    if (uVar6 == 0) {
      lVar7 = 0;
    }
    uVar14 = lVar7 + uVar14;
    (this->optimal_parameters).table_size = uVar14;
    uVar8 = this->minimum_number_of_hashes;
    if ((uVar5 < uVar8) || (uVar8 = this->maximum_number_of_hashes, uVar8 < uVar5)) {
      (this->optimal_parameters).number_of_hashes = uVar8;
    }
    uVar6 = this->minimum_size;
    if ((uVar14 < uVar6) || (uVar6 = this->maximum_size, uVar6 < uVar14)) {
      (this->optimal_parameters).table_size = uVar6;
    }
  }
  return !bVar4;
}

Assistant:

virtual bool compute_optimal_parameters()
   {
      /*
        Note:
        The following will attempt to find the number of hash functions
        and minimum amount of storage bits required to construct a bloom
        filter consistent with the user defined false positive probability
        and estimated element insertion count.
      */

      if (!(*this))
         return false;

      double min_m  = std::numeric_limits<double>::infinity();
      double min_k  = 0.0;
      double k      = 1.0;

      while (k < 1000.0)
      {
         const double numerator   = (- k * projected_element_count);
         const double denominator = std::log(1.0 - std::pow(false_positive_probability, 1.0 / k));

         const double curr_m = numerator / denominator;

         if (curr_m < min_m)
         {
            min_m = curr_m;
            min_k = k;
         }

         k += 1.0;
      }

      optimal_parameters_t& optp = optimal_parameters;

      optp.number_of_hashes = static_cast<unsigned int>(min_k);

      optp.table_size = static_cast<unsigned long long int>(min_m);

      optp.table_size += (((optp.table_size % bits_per_char) != 0) ? (bits_per_char - (optp.table_size % bits_per_char)) : 0);

      if (optp.number_of_hashes < minimum_number_of_hashes)
         optp.number_of_hashes = minimum_number_of_hashes;
      else if (optp.number_of_hashes > maximum_number_of_hashes)
         optp.number_of_hashes = maximum_number_of_hashes;

      if (optp.table_size < minimum_size)
         optp.table_size = minimum_size;
      else if (optp.table_size > maximum_size)
         optp.table_size = maximum_size;

      return true;
   }